

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

int __thiscall
ON_HistoryRecord::GetIntValues(ON_HistoryRecord *this,int value_id,ON_SimpleArray<int> *a)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_IntValue *v;
  ON_SimpleArray<int> *a_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  ON_SimpleArray<int>::SetCount(a,0);
  pOVar2 = FindValueHelper(this,value_id,2,false);
  if (pOVar2 != (ON_Value *)0x0) {
    ON_SimpleArray<int>::operator=(a,(ON_SimpleArray<int> *)(pOVar2 + 1));
  }
  iVar1 = ON_SimpleArray<int>::Count(a);
  return iVar1;
}

Assistant:

int ON_HistoryRecord::GetIntValues( int value_id, ON_SimpleArray<int>& a ) const
{
  a.SetCount(0);
  const ON_IntValue* v = static_cast<ON_IntValue*>(FindValueHelper(value_id,ON_Value::int_value,0));
  if ( v )
  {
    a = v->m_value;
  }
  return a.Count();
}